

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmh.h
# Opt level: O0

size_t __thiscall
frozen::bits::pmh_tables<64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>::
lookup<std::basic_string_view<char,std::char_traits<char>>,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
          (pmh_tables<64UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *this,basic_string_view<char,_std::char_traits<char>_> *key,
          elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *hasher)

{
  string_view value;
  string_view value_00;
  bool bVar1;
  size_t sVar2;
  const_reference pvVar3;
  elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *this_00;
  const_reference pvVar4;
  carray<frozen::bits::seed_or_index,_64UL> *this_01;
  size_t in_RDX;
  size_t in_RDI;
  value_type d;
  size_t in_stack_ffffffffffffff98;
  elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_ffffffffffffffa0;
  seed_or_index local_28;
  size_t local_20;
  value_type local_8;
  
  this_01 = (carray<frozen::bits::seed_or_index,_64UL> *)(in_RDI + 8);
  value._M_str = (char *)this_01;
  value._M_len = in_RDI;
  local_20 = in_RDX;
  sVar2 = elsa<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                    (in_stack_ffffffffffffffa0,value,in_stack_ffffffffffffff98);
  pvVar3 = carray<frozen::bits::seed_or_index,_64UL>::operator[](this_01,sVar2 & 0x3f);
  local_28.value_ = pvVar3->value_;
  bVar1 = seed_or_index::is_seed(&local_28);
  if (bVar1) {
    this_00 = (elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *)(in_RDI + 0x208);
    seed_or_index::value(&local_28);
    value_00._M_str = (char *)this_01;
    value_00._M_len = in_RDI;
    sVar2 = elsa<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                      (this_00,value_00,local_20);
    pvVar4 = carray<unsigned_long,_64UL>::operator[]
                       ((carray<unsigned_long,_64UL> *)this_00,sVar2 & 0x3f);
    local_8 = *pvVar4;
  }
  else {
    local_8 = seed_or_index::value(&local_28);
  }
  return local_8;
}

Assistant:

constexpr std::size_t lookup(const KeyType & key, const HasherType& hasher) const {
    auto const d = first_table_[hasher(key, static_cast<size_t>(first_seed_)) % M];
    if (!d.is_seed()) { return static_cast<std::size_t>(d.value()); } // this is narrowing uint64 -> size_t but should be fine
    else { return second_table_[hasher(key, static_cast<std::size_t>(d.value())) % M]; }
  }